

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O3

QString * __thiscall
CPP::WriteInitialization::Item::writeSetupUi
          (QString *__return_storage_ptr__,Item *this,QString *parent,
          EmptyItemPolicy emptyItemPolicy)

{
  QString *pQVar1;
  QString *pQVar2;
  TemporaryVariableGeneratorPolicy TVar3;
  Driver *this_00;
  QMapData<std::multimap<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>
  *pQVar4;
  long lVar5;
  Item **ppIVar6;
  bool bVar7;
  Language LVar8;
  QTextStream *pQVar9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  _Rb_tree_node_base *p_Var12;
  long lVar13;
  long in_FS_OFFSET;
  QString local_d0;
  QString local_b8;
  QString local_98;
  QStringBuilder<QLatin1String,_QString> local_78;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  TVar3 = (this->m_setupUiData).policy;
  if (TVar3 == DontGenerate && emptyItemPolicy == DontConstruct) {
LAB_00131de6:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
    goto LAB_00132277;
  }
  if ((emptyItemPolicy == ConstructItemOnly) && ((this->m_children).d.size == 0)) {
    if (TVar3 != GenerateWithMultiDirective) {
      if (TVar3 == DontGenerate) {
        pQVar9 = (QTextStream *)QTextStream::operator<<(this->m_setupUiStream,&this->m_indent);
        pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,(QString *)&language::operatorNew);
        pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,&this->m_itemClassName);
        pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,'(');
        pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,parent);
        pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,')');
        QTextStream::operator<<(pQVar9,(QString *)&language::eol);
        goto LAB_00131de6;
      }
      goto LAB_00131e28;
    }
    generateMultiDirectiveBegin(this->m_setupUiStream,&(this->m_setupUiData).directives);
    bVar7 = true;
  }
  else {
LAB_00131e28:
    bVar7 = false;
  }
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = this->m_driver;
  pQVar1 = &this->m_itemClassName;
  QString::toLower_helper(&local_98);
  local_78.b.d.size = local_98.d.size;
  local_78.b.d.ptr = local_98.d.ptr;
  local_78.b.d.d = local_98.d.d;
  local_78.a.m_size = 2;
  local_78.a.m_data = "__";
  local_98.d.d = (Data *)0x0;
  local_98.d.ptr = (char16_t *)0x0;
  local_98.d.size = 0;
  QStringBuilder<QLatin1String,_QString>::convertTo<QString>(&local_50,&local_78);
  local_b8.d.size = 0;
  local_b8.d.d = (Data *)0x0;
  local_b8.d.ptr = (char16_t *)0x0;
  Driver::unique(__return_storage_ptr__,this_00,&local_50,&local_b8);
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_78.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.b.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar2 = &this->m_indent;
  QTextStream::operator<<(this->m_setupUiStream,pQVar2);
  LVar8 = language::language();
  if (LVar8 == Cpp) {
    pQVar9 = (QTextStream *)QTextStream::operator<<(this->m_setupUiStream,pQVar1);
    QTextStream::operator<<(pQVar9," *");
  }
  pQVar9 = (QTextStream *)QTextStream::operator<<(this->m_setupUiStream,__return_storage_ptr__);
  pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9," = ");
  pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,(QString *)&language::operatorNew);
  pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,pQVar1);
  pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,'(');
  pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,parent);
  pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,')');
  QTextStream::operator<<(pQVar9,(QString *)&language::eol);
  if (bVar7) {
    QTextStream::operator<<(this->m_setupUiStream,"#else\n");
    pQVar9 = (QTextStream *)QTextStream::operator<<(this->m_setupUiStream,pQVar2);
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,(QString *)&language::operatorNew);
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,pQVar1);
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,'(');
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,parent);
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,')');
    QTextStream::operator<<(pQVar9,(QString *)&language::eol);
    generateMultiDirectiveEnd
              (this->m_setupUiStream,(QSet<QString> *)(this->m_setupUiData).directives.q_hash.d);
  }
  pQVar4 = (this->m_setupUiData).setters.d.d.ptr;
  if (pQVar4 == (QMapData<std::multimap<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>
                 *)0x0) {
    p_Var10 = (_Base_ptr)0x0;
  }
  else {
    p_Var10 = *(_Base_ptr *)((long)&(pQVar4->m)._M_t._M_impl + 0x18);
  }
  p_Var11 = (_Base_ptr)((long)&(pQVar4->m)._M_t._M_impl + 8);
  if (pQVar4 == (QMapData<std::multimap<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>
                 *)0x0) {
    p_Var11 = (_Base_ptr)0x0;
  }
  if (p_Var10 != p_Var11) {
    do {
      if (p_Var10[1]._M_left != (_Base_ptr)0x0) {
        local_78.a.m_data = (char *)p_Var10[1]._M_parent;
        local_78.a.m_size = (qsizetype)p_Var10[1]._M_left;
        language::operator<<(this->m_setupUiStream,(openQtConfig *)&local_78);
      }
      pQVar9 = (QTextStream *)QTextStream::operator<<(this->m_setupUiStream,pQVar2);
      pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,__return_storage_ptr__);
      pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,(QString *)&p_Var10[1]._M_right);
      Qt::endl(pQVar9);
      if (p_Var10[1]._M_left != (_Base_ptr)0x0) {
        local_78.a.m_data = (char *)p_Var10[1]._M_parent;
        local_78.a.m_size = (qsizetype)p_Var10[1]._M_left;
        language::operator<<(this->m_setupUiStream,(closeQtConfig *)&local_78);
      }
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
      pQVar4 = (this->m_setupUiData).setters.d.d.ptr;
      p_Var12 = (_Rb_tree_node_base *)((long)&(pQVar4->m)._M_t._M_impl + 8);
      if (pQVar4 == (QMapData<std::multimap<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>
                     *)0x0) {
        p_Var12 = (_Rb_tree_node_base *)0x0;
      }
    } while (p_Var10 != p_Var12);
  }
  lVar5 = (this->m_children).d.size;
  if (lVar5 != 0) {
    ppIVar6 = (this->m_children).d.ptr;
    lVar13 = 0;
    do {
      writeSetupUi(&local_d0,*(Item **)((long)ppIVar6 + lVar13),__return_storage_ptr__,
                   ConstructItemOnly);
      if (&(local_d0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_d0.d.d)->super_QArrayData,2,0x10);
        }
      }
      lVar13 = lVar13 + 8;
    } while (lVar5 << 3 != lVar13);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_00132277:
  __stack_chk_fail();
}

Assistant:

QString WriteInitialization::Item::writeSetupUi(const QString &parent, Item::EmptyItemPolicy emptyItemPolicy)
{
    if (emptyItemPolicy == Item::DontConstruct && m_setupUiData.policy == ItemData::DontGenerate)
        return {};

    bool generateMultiDirective = false;
    if (emptyItemPolicy == Item::ConstructItemOnly && m_children.isEmpty()) {
        if (m_setupUiData.policy == ItemData::DontGenerate) {
            m_setupUiStream << m_indent << language::operatorNew << m_itemClassName
                << '(' << parent << ')' << language::eol;
            return {};
        }
        if (m_setupUiData.policy == ItemData::GenerateWithMultiDirective)
            generateMultiDirective = true;
    }

    if (generateMultiDirective)
        generateMultiDirectiveBegin(m_setupUiStream, m_setupUiData.directives);

    const QString uniqueName = m_driver->unique("__"_L1 + m_itemClassName.toLower());
    m_setupUiStream << m_indent;
    if (language::language() == Language::Cpp)
        m_setupUiStream << m_itemClassName << " *";
    m_setupUiStream << uniqueName
        << " = " << language::operatorNew << m_itemClassName << '(' << parent
        << ')' << language::eol;

    if (generateMultiDirective) {
        m_setupUiStream << "#else\n";
        m_setupUiStream << m_indent << language::operatorNew << m_itemClassName
            << '(' << parent << ')' << language::eol;
        generateMultiDirectiveEnd(m_setupUiStream, m_setupUiData.directives);
    }

    QMultiMap<QString, QString>::ConstIterator it = m_setupUiData.setters.constBegin();
    while (it != m_setupUiData.setters.constEnd()) {
        if (!it.key().isEmpty())
            m_setupUiStream << language::openQtConfig(it.key());
        m_setupUiStream << m_indent << uniqueName << it.value() << Qt::endl;
        if (!it.key().isEmpty())
            m_setupUiStream << language::closeQtConfig(it.key());
        ++it;
    }
    for (Item *child : std::as_const(m_children))
        child->writeSetupUi(uniqueName);
    return uniqueName;
}